

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_calculation.cc
# Opt level: O2

void __thiscall
sptk::HistogramCalculation::HistogramCalculation
          (HistogramCalculation *this,int num_bin,double lower_bound,double upper_bound)

{
  this->_vptr_HistogramCalculation = (_func_int **)&PTR__HistogramCalculation_00111cd0;
  this->num_bin_ = num_bin;
  this->lower_bound_ = lower_bound;
  this->upper_bound_ = upper_bound;
  this->bin_width_ = (upper_bound - lower_bound) / (double)num_bin;
  this->is_valid_ = lower_bound < upper_bound && 0 < num_bin;
  return;
}

Assistant:

HistogramCalculation::HistogramCalculation(int num_bin, double lower_bound,
                                           double upper_bound)
    : num_bin_(num_bin),
      lower_bound_(lower_bound),
      upper_bound_(upper_bound),
      bin_width_((upper_bound_ - lower_bound_) / num_bin_),
      is_valid_(true) {
  if (num_bin_ <= 0 || upper_bound_ <= lower_bound_) {
    is_valid_ = false;
    return;
  }
}